

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_hierarchy.cc
# Opt level: O0

void __thiscall lf::refinement::MeshHierarchy::RefineRegular(MeshHierarchy *this,RefPat ref_pat)

{
  bool bVar1;
  uint uVar2;
  runtime_error *prVar3;
  __shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  reference ppEVar7;
  reference pvVar8;
  CellChildInfo *cell_child_info;
  glb_idx_t cell_index;
  Entity *cell;
  iterator __end2_2;
  iterator __begin2_2;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range2_2;
  EdgeChildInfo *ed_child_info;
  glb_idx_t edge_index;
  Entity *edge;
  iterator __end2_1;
  iterator __begin2_1;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range2_1;
  PointChildInfo *pt_child_info;
  glb_idx_t point_index;
  Entity *point;
  iterator __end2;
  iterator __begin2;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range2;
  allocator<char> local_801;
  string local_800;
  allocator<char> local_7d9;
  string local_7d8;
  stringstream local_7b8 [8];
  stringstream ss_3;
  ostream local_7a8 [376];
  string local_630;
  allocator<char> local_609;
  string local_608;
  allocator<char> local_5e1;
  string local_5e0;
  stringstream local_5c0 [8];
  stringstream ss_2;
  ostream local_5b0 [376];
  string local_438;
  allocator<char> local_411;
  string local_410;
  allocator<char> local_3e9;
  string local_3e8;
  stringstream local_3c8 [8];
  stringstream ss_1;
  ostream local_3b8 [376];
  reference local_240;
  vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
  *finest_cell_ci;
  vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>
  *finest_edge_ci;
  vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>
  *finest_point_ci;
  Mesh *finest_mesh;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [380];
  RefPat local_14;
  MeshHierarchy *pMStack_10;
  RefPat ref_pat_local;
  MeshHierarchy *this_local;
  
  local_14 = ref_pat;
  pMStack_10 = this;
  if ((ref_pat != rp_regular) && (ref_pat != rp_barycentric)) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::operator<<(local_190,"Only regular or barycentric uniform refinement possible");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,
               "ref_pat == RefPat::rp_regular || ref_pat == RefPat::rp_barycentric",&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
               ,&local_1f9);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d0,&local_1f8,0x4b,(string *)&finest_mesh);
    std::__cxx11::string::~string((string *)&finest_mesh);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"this code should not be reached");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = (__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            std::
            vector<std::shared_ptr<lf::mesh::Mesh>,_std::allocator<std::shared_ptr<lf::mesh::Mesh>_>_>
            ::back(&this->meshes_);
  finest_point_ci =
       (vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_> *)
       std::__shared_ptr_access<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                 (this_00);
  finest_edge_ci =
       (vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_> *)
       std::
       vector<std::vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>,_std::allocator<std::vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>_>_>
       ::back(&this->point_child_infos_);
  finest_cell_ci =
       (vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_> *)
       std::
       vector<std::vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>,_std::allocator<std::vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>_>_>
       ::back(&this->edge_child_infos_);
  local_240 = std::
              vector<std::vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>,_std::allocator<std::vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>_>_>
              ::back(&this->cell_child_infos_);
  sVar4 = std::
          vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>::
          size((vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>
                *)finest_edge_ci);
  uVar2 = (*(code *)(finest_point_ci->
                    super__Vector_base<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>
                    )._M_impl.super__Vector_impl_data._M_start[3])(finest_point_ci,2);
  if (sVar4 != uVar2) {
    std::__cxx11::stringstream::stringstream(local_3c8);
    std::operator<<(local_3b8,"length mismatch PointChildInfo vector");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e8,"finest_point_ci.size() == finest_mesh.NumEntities(2)",
               &local_3e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_410,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
               ,&local_411);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_3e8,&local_410,0x54,&local_438);
    std::__cxx11::string::~string((string *)&local_438);
    std::__cxx11::string::~string((string *)&local_410);
    std::allocator<char>::~allocator(&local_411);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::allocator<char>::~allocator(&local_3e9);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"this code should not be reached");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar4 = std::vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>
          ::size((vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>
                  *)finest_cell_ci);
  uVar2 = (*(code *)(finest_point_ci->
                    super__Vector_base<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>
                    )._M_impl.super__Vector_impl_data._M_start[3])(finest_point_ci,1);
  if (sVar4 != uVar2) {
    std::__cxx11::stringstream::stringstream(local_5c0);
    std::operator<<(local_5b0,"length mismatch EdgeChildInfo vector");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5e0,"finest_edge_ci.size() == finest_mesh.NumEntities(1)",&local_5e1
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_608,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
               ,&local_609);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_5e0,&local_608,0x56,&local_630);
    std::__cxx11::string::~string((string *)&local_630);
    std::__cxx11::string::~string((string *)&local_608);
    std::allocator<char>::~allocator(&local_609);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::allocator<char>::~allocator(&local_5e1);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"this code should not be reached");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar4 = std::vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>
          ::size(local_240);
  uVar2 = (*(code *)(finest_point_ci->
                    super__Vector_base<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>
                    )._M_impl.super__Vector_impl_data._M_start[3])(finest_point_ci,0);
  if (sVar4 != uVar2) {
    std::__cxx11::stringstream::stringstream(local_7b8);
    std::operator<<(local_7a8,"length mismatch CellChildInfo vector");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7d8,"finest_cell_ci.size() == finest_mesh.NumEntities(0)",&local_7d9
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_800,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/refinement/mesh_hierarchy.cc"
               ,&local_801);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_7d8,&local_800,0x58,(string *)&__range2);
    std::__cxx11::string::~string((string *)&__range2);
    std::__cxx11::string::~string((string *)&local_800);
    std::allocator<char>::~allocator(&local_801);
    std::__cxx11::string::~string((string *)&local_7d8);
    std::allocator<char>::~allocator(&local_7d9);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"this code should not be reached");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __begin2._M_current =
       (Entity **)
       (*(code *)(finest_point_ci->
                 super__Vector_base<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>
                 )._M_impl.super__Vector_impl_data._M_start[2])(finest_point_ci,2);
  __end2 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                     ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2);
  point = (Entity *)
          std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                    ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                      (&__end2,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                *)&point);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppEVar7 = __gnu_cxx::
              __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
              ::operator*(&__end2);
    uVar2 = (*(code *)(finest_point_ci->
                      super__Vector_base<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>
                      )._M_impl.super__Vector_impl_data._M_start[5])(finest_point_ci,*ppEVar7);
    pvVar5 = std::
             vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>
             ::operator[]((vector<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>
                           *)finest_edge_ci,(ulong)uVar2);
    pvVar5->ref_pat = rp_copy;
    __gnu_cxx::
    __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
    ::operator++(&__end2);
  }
  __begin2_1._M_current =
       (Entity **)
       (*(code *)(finest_point_ci->
                 super__Vector_base<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>
                 )._M_impl.super__Vector_impl_data._M_start[2])(finest_point_ci,1);
  __end2_1 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                       ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2_1);
  edge = (Entity *)
         std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                   ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2_1);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                      (&__end2_1,
                       (__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                        *)&edge);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppEVar7 = __gnu_cxx::
              __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
              ::operator*(&__end2_1);
    uVar2 = (*(code *)(finest_point_ci->
                      super__Vector_base<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>
                      )._M_impl.super__Vector_impl_data._M_start[5])(finest_point_ci,*ppEVar7);
    pvVar6 = std::
             vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>::
             operator[]((vector<lf::refinement::EdgeChildInfo,_std::allocator<lf::refinement::EdgeChildInfo>_>
                         *)finest_cell_ci,(ulong)uVar2);
    pvVar6->ref_pat_ = rp_split;
    __gnu_cxx::
    __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
    ::operator++(&__end2_1);
  }
  __begin2_2._M_current =
       (Entity **)
       (*(code *)(finest_point_ci->
                 super__Vector_base<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>
                 )._M_impl.super__Vector_impl_data._M_start[2])(finest_point_ci,0);
  __end2_2 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                       ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2_2);
  cell = (Entity *)
         std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                   ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin2_2);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                      (&__end2_2,
                       (__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                        *)&cell);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppEVar7 = __gnu_cxx::
              __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
              ::operator*(&__end2_2);
    uVar2 = (*(code *)(finest_point_ci->
                      super__Vector_base<lf::refinement::PointChildInfo,_std::allocator<lf::refinement::PointChildInfo>_>
                      )._M_impl.super__Vector_impl_data._M_start[5])(finest_point_ci,*ppEVar7);
    pvVar8 = std::
             vector<lf::refinement::CellChildInfo,_std::allocator<lf::refinement::CellChildInfo>_>::
             operator[](local_240,(ulong)uVar2);
    pvVar8->ref_pat_ = local_14;
    __gnu_cxx::
    __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
    ::operator++(&__end2_2);
  }
  PerformRefinement(this);
  initGeometryInParent(this);
  return;
}

Assistant:

void MeshHierarchy::RefineRegular(RefPat ref_pat) {
  LF_VERIFY_MSG(
      ref_pat == RefPat::rp_regular || ref_pat == RefPat::rp_barycentric,
      "Only regular or barycentric uniform refinement possible");
  // Retrieve the finest mesh in the hierarchy
  const mesh::Mesh &finest_mesh(*meshes_.back());
  // Arrays containing refinement information for finest mesh
  std::vector<PointChildInfo> &finest_point_ci(point_child_infos_.back());
  std::vector<EdgeChildInfo> &finest_edge_ci(edge_child_infos_.back());
  std::vector<CellChildInfo> &finest_cell_ci(cell_child_infos_.back());

  LF_VERIFY_MSG(finest_point_ci.size() == finest_mesh.NumEntities(2),
                "length mismatch PointChildInfo vector");
  LF_VERIFY_MSG(finest_edge_ci.size() == finest_mesh.NumEntities(1),
                "length mismatch EdgeChildInfo vector");
  LF_VERIFY_MSG(finest_cell_ci.size() == finest_mesh.NumEntities(0),
                "length mismatch CellChildInfo vector");

  // Flag all points as to be copied
  for (const mesh::Entity *point : finest_mesh.Entities(2)) {
    const lf::base::glb_idx_t point_index = finest_mesh.Index(*point);
    PointChildInfo &pt_child_info(finest_point_ci[point_index]);
    // Set the information about a point's children except the child pointer
    pt_child_info.ref_pat = RefPat::rp_copy;
  }
  // Flag all edges as to be split
  for (const mesh::Entity *edge : finest_mesh.Entities(1)) {
    const lf::base::glb_idx_t edge_index = finest_mesh.Index(*edge);
    EdgeChildInfo &ed_child_info(finest_edge_ci[edge_index]);
    ed_child_info.ref_pat_ = RefPat::rp_split;
  }
  // All cells are to be refined regularly
  for (const mesh::Entity *cell : finest_mesh.Entities(0)) {
    const lf::base::glb_idx_t cell_index = finest_mesh.Index(*cell);
    CellChildInfo &cell_child_info(finest_cell_ci[cell_index]);
    cell_child_info.ref_pat_ = ref_pat;
  }
  // With all refinement patterns set, generate the new mesh
  PerformRefinement();
  // Finish initialization
  initGeometryInParent();
}